

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es3fPrimitiveRestartTests.cpp
# Opt level: O3

void __thiscall
deqp::gles3::Functional::PrimitiveRestartCase::addIndex(PrimitiveRestartCase *this,deUint32 index)

{
  IndexType IVar1;
  iterator __position;
  iterator __position_00;
  undefined8 in_RAX;
  undefined8 local_8;
  
  IVar1 = this->m_indexType;
  if (IVar1 == INDEX_UNSIGNED_INT) {
    local_8._0_4_ = (undefined4)in_RAX;
    local_8 = CONCAT44(index,(undefined4)local_8);
    __position_00._M_current =
         (this->m_indicesUI).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl
         .super__Vector_impl_data._M_finish;
    if (__position_00._M_current ==
        (this->m_indicesUI).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
        super__Vector_impl_data._M_end_of_storage) {
      std::vector<unsigned_int,_std::allocator<unsigned_int>_>::_M_realloc_insert<unsigned_int>
                (&this->m_indicesUI,__position_00,(uint *)((long)&local_8 + 4));
    }
    else {
      *__position_00._M_current = index;
      (this->m_indicesUI).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
      super__Vector_impl_data._M_finish = __position_00._M_current + 1;
    }
  }
  else if (IVar1 == INDEX_UNSIGNED_SHORT) {
    local_8 = CONCAT62((int6)((ulong)in_RAX >> 0x10),(unsigned_short)index);
    __position._M_current =
         (this->m_indicesUS).super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>.
         _M_impl.super__Vector_impl_data._M_finish;
    if (__position._M_current ==
        (this->m_indicesUS).super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>.
        _M_impl.super__Vector_impl_data._M_end_of_storage) {
      std::vector<unsigned_short,_std::allocator<unsigned_short>_>::
      _M_realloc_insert<unsigned_short>(&this->m_indicesUS,__position,(unsigned_short *)&local_8);
    }
    else {
      *__position._M_current = (unsigned_short)index;
      (this->m_indicesUS).super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>.
      _M_impl.super__Vector_impl_data._M_finish = __position._M_current + 1;
    }
  }
  else if (IVar1 == INDEX_UNSIGNED_BYTE) {
    local_8._4_4_ = (undefined4)((ulong)in_RAX >> 0x20);
    local_8._0_4_ = CONCAT13((char)index,(int3)in_RAX);
    std::vector<unsigned_char,_std::allocator<unsigned_char>_>::emplace_back<unsigned_char>
              (&this->m_indicesUB,(uchar *)((long)&local_8 + 3));
  }
  return;
}

Assistant:

void PrimitiveRestartCase::addIndex (deUint32 index)
{
	if (m_indexType == INDEX_UNSIGNED_BYTE)
	{
		DE_ASSERT(de::inRange(index, (deUint32)0, MAX_UNSIGNED_BYTE));
		m_indicesUB.push_back((deUint8)index);
	}
	else if (m_indexType == INDEX_UNSIGNED_SHORT)
	{
		DE_ASSERT(de::inRange(index, (deUint32)0, MAX_UNSIGNED_SHORT));
		m_indicesUS.push_back((deUint16)index);
	}
	else if (m_indexType == INDEX_UNSIGNED_INT)
	{
		DE_ASSERT(de::inRange(index, (deUint32)0, MAX_UNSIGNED_INT));
		m_indicesUI.push_back((deUint32)index);
	}
	else
		DE_ASSERT(DE_FALSE);
}